

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestEnum_Test::
~ConvertDescriptorToTypeTest_TestEnum_Test(ConvertDescriptorToTypeTest_TestEnum_Test *this)

{
  ConvertDescriptorToTypeTest_TestEnum_Test *this_local;
  
  ~ConvertDescriptorToTypeTest_TestEnum_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestEnum) {
  Enum type = ConvertDescriptorToType(
      *proto2_unittest::TestAllTypes::NestedEnum_descriptor());
  EnumHasValue(type, "FOO", 1);
  EnumHasValue(type, "BAR", 2);
  EnumHasValue(type, "BAZ", 3);
  EnumHasValue(type, "NEG", -1);
}